

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_13x13(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  INT32 z2;
  INT32 z1;
  INT32 tmp15;
  INT32 tmp14;
  INT32 tmp13;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp6;
  INT32 tmp5;
  INT32 tmp4;
  INT32 tmp3;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  int local_154;
  int *local_148;
  int *local_140;
  int local_138 [8];
  int local_118 [8];
  int local_f8 [8];
  int local_d8 [8];
  int local_b8 [10];
  long local_90;
  long local_88;
  long lStack_80;
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *wsptr;
  DCTELEM *dataptr;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  uint local_14;
  long local_10;
  int *local_8;
  
  local_154 = 0;
  local_140 = in_RDI;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    while( true ) {
      pbVar7 = (byte *)(*(long *)(local_10 + (long)local_154 * 8) + (ulong)local_14);
      local_20 = (long)(int)((uint)*pbVar7 + (uint)pbVar7[0xc]);
      local_28 = (long)(int)((uint)pbVar7[1] + (uint)pbVar7[0xb]);
      local_30 = (long)(int)((uint)pbVar7[2] + (uint)pbVar7[10]);
      local_38 = (long)(int)((uint)pbVar7[3] + (uint)pbVar7[9]);
      local_40 = (long)(int)((uint)pbVar7[4] + (uint)pbVar7[8]);
      local_48 = (long)(int)((uint)pbVar7[5] + (uint)pbVar7[7]);
      local_50 = (long)(int)(uint)pbVar7[6];
      local_58 = (long)(int)((uint)*pbVar7 - (uint)pbVar7[0xc]);
      local_60 = (long)(int)((uint)pbVar7[1] - (uint)pbVar7[0xb]);
      dataptr = (DCTELEM *)(long)(int)((uint)pbVar7[2] - (uint)pbVar7[10]);
      wsptr = (DCTELEM *)(long)(int)((uint)pbVar7[3] - (uint)pbVar7[9]);
      elemptr = (JSAMPROW)(long)(int)((uint)pbVar7[4] - (uint)pbVar7[8]);
      lStack_80 = (long)(int)((uint)pbVar7[5] - (uint)pbVar7[7]);
      *local_140 = (uint)*pbVar7 + (uint)pbVar7[0xc] + (uint)pbVar7[1] + (uint)pbVar7[0xb] +
                   (uint)pbVar7[2] + (uint)pbVar7[10] + (uint)pbVar7[3] + (uint)pbVar7[9] +
                   (uint)pbVar7[4] + (uint)pbVar7[8] + (uint)pbVar7[5] + (uint)pbVar7[7] +
                   (uint)pbVar7[6] + -0x680;
      local_20 = local_20 + local_50 * -2;
      local_28 = local_28 + local_50 * -2;
      local_30 = local_30 + local_50 * -2;
      local_38 = local_38 + local_50 * -2;
      local_40 = local_40 + local_50 * -2;
      local_48 = local_48 + local_50 * -2;
      local_140[2] = (int)(local_20 * 0x2bf1 + local_28 * 0x21e0 + local_30 * 0x100c +
                           local_38 * -0x574 + local_40 * -0x19b5 + local_48 * -0x2812 + 0x1000 >>
                          0xd);
      local_88 = (local_20 - local_30) * 0x24f9 + (local_38 - local_40) * -0xdf2 +
                 (local_28 - local_48) * -0xa20;
      local_90 = (local_20 + local_30) * 0x319 + (local_38 + local_40) * -0x1dfe +
                 (local_28 + local_48) * 0xf95;
      local_140[4] = (int)(local_88 + local_90 + 0x1000 >> 0xd);
      local_140[6] = (int)((local_88 - local_90) + 0x1000 >> 0xd);
      lVar8 = (local_58 + local_60) * 0x2a50;
      lVar9 = (local_58 + (long)dataptr) * 0x253e;
      lVar10 = (local_58 + (long)wsptr) * 0x1e02 + (long)(elemptr + lStack_80) * 0xad5;
      lVar11 = ((long)elemptr - lStack_80) * 0x1e02 + (local_60 + (long)dataptr) * -0xad5;
      lVar12 = (local_60 + (long)wsptr) * -0x253e;
      local_28 = lVar11 + lVar12 + local_60 * 0x1acb + (long)elemptr * -0x4aef + lVar8;
      lVar13 = ((long)dataptr + (long)wsptr) * -0x1508;
      local_30 = lVar11 + lVar13 + (long)dataptr * -0x324f + lStack_80 * 0x4853 + lVar9;
      local_38 = lVar12 + lVar13 + (long)wsptr * 0x4694 + lStack_80 * -0x37c1 + lVar10;
      local_140[1] = (int)(lVar8 + lVar9 + lVar10 + local_58 * -0x40a5 + (long)elemptr * 0xa33 +
                           0x1000 >> 0xd);
      local_140[3] = (int)(local_28 + 0x1000 >> 0xd);
      local_140[5] = (int)(local_30 + 0x1000 >> 0xd);
      local_140[7] = (int)(local_38 + 0x1000 >> 0xd);
      local_154 = local_154 + 1;
      if (local_154 != 8) break;
      local_140 = local_138;
    }
    if (local_154 == 0xd) break;
    local_140 = local_140 + 8;
  }
  local_140 = local_8;
  local_148 = local_138;
  for (local_154 = 7; -1 < local_154; local_154 = local_154 + -1) {
    iVar1 = *local_140;
    iVar2 = local_148[0x20];
    iVar3 = local_148[0x18];
    iVar4 = local_148[0x10];
    iVar5 = local_148[8];
    iVar6 = *local_148;
    lVar8 = (long)local_140[0x30];
    lVar9 = (long)(*local_140 - local_148[0x20]);
    lVar10 = (long)(local_140[8] - local_148[0x18]);
    lVar11 = (long)(local_140[0x10] - local_148[0x10]);
    lVar12 = (long)(local_140[0x18] - local_148[8]);
    lVar13 = (long)(local_140[0x20] - *local_148);
    lVar14 = (long)(local_140[0x28] - local_140[0x38]);
    *local_140 = (int)(((long)(iVar1 + iVar2) + (long)(local_140[8] + iVar3) +
                        (long)(local_140[0x10] + iVar4) + (long)(local_140[0x18] + iVar5) +
                        (long)(local_140[0x20] + iVar6) + (long)(local_140[0x28] + local_140[0x38])
                       + lVar8) * 0x183d + 0x2000 >> 0xe);
    lVar15 = (long)(iVar1 + iVar2) + lVar8 * -2;
    lVar16 = (long)(local_140[8] + iVar3) + lVar8 * -2;
    lVar17 = (long)(local_140[0x10] + iVar4) + lVar8 * -2;
    lVar18 = (long)(local_140[0x18] + iVar5) + lVar8 * -2;
    lVar19 = (long)(local_140[0x20] + iVar6) + lVar8 * -2;
    lVar8 = (long)(local_140[0x28] + local_140[0x38]) + lVar8 * -2;
    local_140[0x10] =
         (int)(lVar15 * 0x2148 + lVar16 * 0x19a8 + lVar17 * 0xc28 + lVar18 * -0x422 +
               lVar19 * -0x1379 + lVar8 * -0x1e5a + 0x2000 >> 0xe);
    lVar20 = (lVar15 - lVar17) * 0x1c01 + (lVar18 - lVar19) * -0xa90 + (lVar16 - lVar8) * -0x7ab;
    lVar8 = (lVar15 + lVar17) * 0x259 + (lVar18 + lVar19) * -0x16b8 + (lVar16 + lVar8) * 0xbcd;
    local_140[0x20] = (int)(lVar20 + lVar8 + 0x2000 >> 0xe);
    local_140[0x30] = (int)((lVar20 - lVar8) + 0x2000 >> 0xe);
    lVar8 = (lVar9 + lVar10) * 0x200c;
    lVar15 = (lVar9 + lVar11) * 0x1c35;
    lVar16 = (lVar9 + lVar12) * 0x16bb + (lVar13 + lVar14) * 0x834;
    lVar17 = (lVar13 - lVar14) * 0x16bb + (lVar10 + lVar11) * -0x834;
    lVar18 = (lVar10 + lVar12) * -0x1c35;
    lVar19 = (lVar11 + lVar12) * -0xfee;
    local_140[8] = (int)(lVar8 + lVar15 + lVar16 + lVar9 * -0x30f6 + lVar13 * 0x7ba + 0x2000 >> 0xe)
    ;
    local_140[0x18] =
         (int)(lVar17 + lVar18 + lVar10 * 0x144b + lVar13 * -0x38c1 + lVar8 + 0x2000 >> 0xe);
    local_140[0x28] =
         (int)(lVar17 + lVar19 + lVar11 * -0x261a + lVar14 * 0x36c7 + lVar15 + 0x2000 >> 0xe);
    local_140[0x38] =
         (int)(lVar18 + lVar19 + lVar12 * 0x3575 + lVar14 * -0x2a3b + lVar16 + 0x2000 >> 0xe);
    local_140 = local_140 + 1;
    local_148 = local_148 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_13x13 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15;
  INT32 z1, z2;
  DCTELEM workspace[8*5];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT. */
  /* cK represents sqrt(2) * cos(K*pi/26). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[12]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[11]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[10]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[9]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[8]);
    tmp5 = GETJSAMPLE(elemptr[5]) + GETJSAMPLE(elemptr[7]);
    tmp6 = GETJSAMPLE(elemptr[6]);

    tmp10 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[12]);
    tmp11 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[11]);
    tmp12 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[10]);
    tmp13 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[9]);
    tmp14 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[8]);
    tmp15 = GETJSAMPLE(elemptr[5]) - GETJSAMPLE(elemptr[7]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      (tmp0 + tmp1 + tmp2 + tmp3 + tmp4 + tmp5 + tmp6 - 13 * CENTERJSAMPLE);
    tmp6 += tmp6;
    tmp0 -= tmp6;
    tmp1 -= tmp6;
    tmp2 -= tmp6;
    tmp3 -= tmp6;
    tmp4 -= tmp6;
    tmp5 -= tmp6;
    dataptr[2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0, FIX(1.373119086)) +   /* c2 */
	      MULTIPLY(tmp1, FIX(1.058554052)) +   /* c6 */
	      MULTIPLY(tmp2, FIX(0.501487041)) -   /* c10 */
	      MULTIPLY(tmp3, FIX(0.170464608)) -   /* c12 */
	      MULTIPLY(tmp4, FIX(0.803364869)) -   /* c8 */
	      MULTIPLY(tmp5, FIX(1.252223920)),    /* c4 */
	      CONST_BITS);
    z1 = MULTIPLY(tmp0 - tmp2, FIX(1.155388986)) - /* (c4+c6)/2 */
	 MULTIPLY(tmp3 - tmp4, FIX(0.435816023)) - /* (c2-c10)/2 */
	 MULTIPLY(tmp1 - tmp5, FIX(0.316450131));  /* (c8-c12)/2 */
    z2 = MULTIPLY(tmp0 + tmp2, FIX(0.096834934)) - /* (c4-c6)/2 */
	 MULTIPLY(tmp3 + tmp4, FIX(0.937303064)) + /* (c2+c10)/2 */
	 MULTIPLY(tmp1 + tmp5, FIX(0.486914739));  /* (c8+c12)/2 */

    dataptr[4] = (DCTELEM) DESCALE(z1 + z2, CONST_BITS);
    dataptr[6] = (DCTELEM) DESCALE(z1 - z2, CONST_BITS);

    /* Odd part */

    tmp1 = MULTIPLY(tmp10 + tmp11, FIX(1.322312651));   /* c3 */
    tmp2 = MULTIPLY(tmp10 + tmp12, FIX(1.163874945));   /* c5 */
    tmp3 = MULTIPLY(tmp10 + tmp13, FIX(0.937797057)) +  /* c7 */
	   MULTIPLY(tmp14 + tmp15, FIX(0.338443458));   /* c11 */
    tmp0 = tmp1 + tmp2 + tmp3 -
	   MULTIPLY(tmp10, FIX(2.020082300)) +          /* c3+c5+c7-c1 */
	   MULTIPLY(tmp14, FIX(0.318774355));           /* c9-c11 */
    tmp4 = MULTIPLY(tmp14 - tmp15, FIX(0.937797057)) -  /* c7 */
	   MULTIPLY(tmp11 + tmp12, FIX(0.338443458));   /* c11 */
    tmp5 = MULTIPLY(tmp11 + tmp13, - FIX(1.163874945)); /* -c5 */
    tmp1 += tmp4 + tmp5 +
	    MULTIPLY(tmp11, FIX(0.837223564)) -         /* c5+c9+c11-c3 */
	    MULTIPLY(tmp14, FIX(2.341699410));          /* c1+c7 */
    tmp6 = MULTIPLY(tmp12 + tmp13, - FIX(0.657217813)); /* -c9 */
    tmp2 += tmp4 + tmp6 -
	    MULTIPLY(tmp12, FIX(1.572116027)) +         /* c1+c5-c9-c11 */
	    MULTIPLY(tmp15, FIX(2.260109708));          /* c3+c7 */
    tmp3 += tmp5 + tmp6 +
	    MULTIPLY(tmp13, FIX(2.205608352)) -         /* c3+c5+c9-c7 */
	    MULTIPLY(tmp15, FIX(1.742345811));          /* c1+c11 */

    dataptr[1] = (DCTELEM) DESCALE(tmp0, CONST_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp1, CONST_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp2, CONST_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp3, CONST_BITS);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == 13)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * We must also scale the output by (8/13)**2 = 64/169, which we partially
   * fold into the constant multipliers and final shifting:
   * cK now represents sqrt(2) * cos(K*pi/26) * 128/169.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*4];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*3];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*2];
    tmp3 = dataptr[DCTSIZE*3] + wsptr[DCTSIZE*1];
    tmp4 = dataptr[DCTSIZE*4] + wsptr[DCTSIZE*0];
    tmp5 = dataptr[DCTSIZE*5] + dataptr[DCTSIZE*7];
    tmp6 = dataptr[DCTSIZE*6];

    tmp10 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*4];
    tmp11 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*3];
    tmp12 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*2];
    tmp13 = dataptr[DCTSIZE*3] - wsptr[DCTSIZE*1];
    tmp14 = dataptr[DCTSIZE*4] - wsptr[DCTSIZE*0];
    tmp15 = dataptr[DCTSIZE*5] - dataptr[DCTSIZE*7];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 + tmp1 + tmp2 + tmp3 + tmp4 + tmp5 + tmp6,
		       FIX(0.757396450)),          /* 128/169 */
	      CONST_BITS+1);
    tmp6 += tmp6;
    tmp0 -= tmp6;
    tmp1 -= tmp6;
    tmp2 -= tmp6;
    tmp3 -= tmp6;
    tmp4 -= tmp6;
    tmp5 -= tmp6;
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0, FIX(1.039995521)) +   /* c2 */
	      MULTIPLY(tmp1, FIX(0.801745081)) +   /* c6 */
	      MULTIPLY(tmp2, FIX(0.379824504)) -   /* c10 */
	      MULTIPLY(tmp3, FIX(0.129109289)) -   /* c12 */
	      MULTIPLY(tmp4, FIX(0.608465700)) -   /* c8 */
	      MULTIPLY(tmp5, FIX(0.948429952)),    /* c4 */
	      CONST_BITS+1);
    z1 = MULTIPLY(tmp0 - tmp2, FIX(0.875087516)) - /* (c4+c6)/2 */
	 MULTIPLY(tmp3 - tmp4, FIX(0.330085509)) - /* (c2-c10)/2 */
	 MULTIPLY(tmp1 - tmp5, FIX(0.239678205));  /* (c8-c12)/2 */
    z2 = MULTIPLY(tmp0 + tmp2, FIX(0.073342435)) - /* (c4-c6)/2 */
	 MULTIPLY(tmp3 + tmp4, FIX(0.709910013)) + /* (c2+c10)/2 */
	 MULTIPLY(tmp1 + tmp5, FIX(0.368787494));  /* (c8+c12)/2 */

    dataptr[DCTSIZE*4] = (DCTELEM) DESCALE(z1 + z2, CONST_BITS+1);
    dataptr[DCTSIZE*6] = (DCTELEM) DESCALE(z1 - z2, CONST_BITS+1);

    /* Odd part */

    tmp1 = MULTIPLY(tmp10 + tmp11, FIX(1.001514908));   /* c3 */
    tmp2 = MULTIPLY(tmp10 + tmp12, FIX(0.881514751));   /* c5 */
    tmp3 = MULTIPLY(tmp10 + tmp13, FIX(0.710284161)) +  /* c7 */
	   MULTIPLY(tmp14 + tmp15, FIX(0.256335874));   /* c11 */
    tmp0 = tmp1 + tmp2 + tmp3 -
	   MULTIPLY(tmp10, FIX(1.530003162)) +          /* c3+c5+c7-c1 */
	   MULTIPLY(tmp14, FIX(0.241438564));           /* c9-c11 */
    tmp4 = MULTIPLY(tmp14 - tmp15, FIX(0.710284161)) -  /* c7 */
	   MULTIPLY(tmp11 + tmp12, FIX(0.256335874));   /* c11 */
    tmp5 = MULTIPLY(tmp11 + tmp13, - FIX(0.881514751)); /* -c5 */
    tmp1 += tmp4 + tmp5 +
	    MULTIPLY(tmp11, FIX(0.634110155)) -         /* c5+c9+c11-c3 */
	    MULTIPLY(tmp14, FIX(1.773594819));          /* c1+c7 */
    tmp6 = MULTIPLY(tmp12 + tmp13, - FIX(0.497774438)); /* -c9 */
    tmp2 += tmp4 + tmp6 -
	    MULTIPLY(tmp12, FIX(1.190715098)) +         /* c1+c5-c9-c11 */
	    MULTIPLY(tmp15, FIX(1.711799069));          /* c3+c7 */
    tmp3 += tmp5 + tmp6 +
	    MULTIPLY(tmp13, FIX(1.670519935)) -         /* c3+c5+c9-c7 */
	    MULTIPLY(tmp15, FIX(1.319646532));          /* c1+c11 */

    dataptr[DCTSIZE*1] = (DCTELEM) DESCALE(tmp0, CONST_BITS+1);
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp1, CONST_BITS+1);
    dataptr[DCTSIZE*5] = (DCTELEM) DESCALE(tmp2, CONST_BITS+1);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp3, CONST_BITS+1);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}